

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDeps
          (DescriptorBuilder *this,string *name,bool build_it)

{
  size_type sVar1;
  FileDescriptor *file;
  Symbol result;
  FileDescriptor *local_18;
  Symbol local_10;
  
  local_10 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it);
  local_18 = Symbol::GetFile(&local_10);
  if ((local_18 != this->file_) &&
     (sVar1 = std::
              set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::count(&this->dependencies_,&local_18), sVar1 == 0)) {
    return (Symbol)local_10.ptr_;
  }
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::erase(&(this->unused_dependency_)._M_t,&local_18);
  return (Symbol)local_10.ptr_;
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDeps(const std::string& name,
                                                     bool build_it) {
  Symbol result = FindSymbolNotEnforcingDepsHelper(pool_, name, build_it);
  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
  }
  return result;
}